

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_lite.cc
# Opt level: O3

bool __thiscall
google::protobuf::MessageLite::SerializePartialToArray(MessageLite *this,void *data,int size)

{
  int iVar1;
  undefined4 extraout_var;
  LogMessage *pLVar2;
  undefined4 extraout_var_00;
  undefined1 local_a8 [8];
  EpsCopyOutputStream out;
  undefined1 local_58 [47];
  LogFinisher local_29;
  ulong value;
  
  iVar1 = (*this->_vptr_MessageLite[9])();
  value = CONCAT44(extraout_var,iVar1);
  if ((value & 0xffffffff80000000) == 0) {
    if (value <= (ulong)(long)size) {
      out.stream_._2_1_ = io::CodedOutputStream::default_serialization_deterministic_ & 1;
      out.end_ = (uint8 *)0x0;
      out.buffer_[0x18] = '\0';
      out.buffer_[0x19] = '\0';
      out.buffer_[0x1a] = '\0';
      out.buffer_[0x1b] = '\0';
      out.buffer_[0x1c] = '\0';
      out.buffer_[0x1d] = '\0';
      out.buffer_[0x1e] = '\0';
      out.buffer_[0x1f] = '\0';
      out.stream_._0_2_ = 0;
      local_a8 = (undefined1  [8])(value + (long)data);
      iVar1 = (*this->_vptr_MessageLite[0xc])(this,data);
      if (value + (long)data != CONCAT44(extraout_var_00,iVar1)) {
        internal::LogMessage::LogMessage
                  ((LogMessage *)&out.had_error_,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O3/src/src/google/protobuf/message_lite.cc"
                   ,0x168);
        pLVar2 = internal::LogMessage::operator<<
                           ((LogMessage *)&out.had_error_,"CHECK failed: target + size == res: ");
        internal::LogFinisher::operator=(&local_29,pLVar2);
        internal::LogMessage::~LogMessage((LogMessage *)&out.had_error_);
      }
      return true;
    }
  }
  else {
    internal::LogMessage::LogMessage
              ((LogMessage *)local_a8,LOGLEVEL_ERROR,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O3/src/src/google/protobuf/message_lite.cc"
               ,0x1e7);
    (*this->_vptr_MessageLite[2])(&out.had_error_,this);
    pLVar2 = internal::LogMessage::operator<<((LogMessage *)local_a8,(string *)&out.had_error_);
    pLVar2 = internal::LogMessage::operator<<(pLVar2," exceeded maximum protobuf size of 2GB: ");
    pLVar2 = internal::LogMessage::operator<<(pLVar2,value);
    internal::LogFinisher::operator=(&local_29,pLVar2);
    if ((undefined1 *)out._56_8_ != local_58) {
      operator_delete((void *)out._56_8_);
    }
    internal::LogMessage::~LogMessage((LogMessage *)local_a8);
  }
  return false;
}

Assistant:

bool MessageLite::SerializePartialToArray(void* data, int size) const {
  const size_t byte_size = ByteSizeLong();
  if (byte_size > INT_MAX) {
    GOOGLE_LOG(ERROR) << GetTypeName()
               << " exceeded maximum protobuf size of 2GB: " << byte_size;
    return false;
  }
  if (size < byte_size) return false;
  uint8* start = reinterpret_cast<uint8*>(data);
  SerializeToArrayImpl(*this, start, byte_size);
  return true;
}